

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O2

void __thiscall wasm::AlignmentLowering::visitStore(AlignmentLowering *this,Store *curr)

{
  ulong uVar1;
  address64_t aVar2;
  UnaryOp op;
  BasicType BVar3;
  Index index;
  Block *expression;
  Memory *pMVar4;
  LocalGet *pLVar5;
  Store *pSVar6;
  Const *right;
  Binary *value;
  Unary *pUVar7;
  ulong extraout_RDX;
  Expression *value_00;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  Drop local_a8;
  Expression *local_90;
  undefined1 local_88 [24];
  Expression *local_70;
  uint local_64;
  Unary *local_60;
  Unary *local_58;
  Address local_50;
  Unary *local_48;
  Index local_3c;
  Builder local_38;
  Builder builder;
  
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
       ).super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       currModule;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id == 1) {
    local_88._0_8_ = Builder::makeDrop(&local_38,curr->ptr);
    local_88._8_8_ = Builder::makeDrop(&local_38,curr->value);
    local_a8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id = 2;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
    local_a8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (LocalSet *)local_88;
    expression = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                           (&local_38,(initializer_list<wasm::Expression_*> *)&local_a8,type);
    goto LAB_00961bc4;
  }
  uVar1 = (curr->align).addr;
  if (uVar1 == 0) {
    return;
  }
  if (uVar1 == curr->bytes) {
    return;
  }
  BVar3 = wasm::Type::getBasic(&curr->value->type);
  switch(BVar3) {
  case i64:
    if (curr->bytes != '\b') {
      (curr->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 2;
      value_00 = curr->value;
      op = WrapInt64;
      goto LAB_00961ba9;
    }
    local_48 = (Unary *)curr->value;
    goto LAB_009619a0;
  case f32:
    (curr->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 2;
    value_00 = curr->value;
    op = ReinterpretFloat32;
LAB_00961ba9:
    pUVar7 = Builder::makeUnary(&local_38,op,value_00);
    curr->value = (Expression *)pUVar7;
  case i32:
    expression = (Block *)lowerStoreI32(this,curr);
    break;
  case f64:
    local_48 = Builder::makeUnary(&local_38,ReinterpretFloat64,curr->value);
LAB_009619a0:
    pMVar4 = Module::getMemory((this->
                               super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                               ).
                               super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .
                               super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .currModule,(Name)(curr->memory).super_IString.str);
    local_70 = (Expression *)(pMVar4->addressType).id;
    local_3c = Builder::addVar((this->
                               super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                               ).
                               super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .
                               super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .currFunction,(Type)local_70);
    local_88._16_8_ = Builder::makeLocalSet(&local_38,local_3c,curr->ptr);
    index = Builder::addVar((this->
                            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                            ).
                            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .
                            super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .currFunction,(Type)0x3);
    local_58 = (Unary *)CONCAT44(local_58._4_4_,index);
    local_48 = (Unary *)Builder::makeLocalSet(&local_38,index,(Expression *)local_48);
    pLVar5 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar5->index = index;
    (pLVar5->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 3;
    local_60 = Builder::makeUnary(&local_38,WrapInt64,(Expression *)pLVar5);
    local_50.addr = (curr->offset).addr;
    local_64 = (uint)(curr->align).addr;
    pLVar5 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar5->index = local_3c;
    (pLVar5->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
         (uintptr_t)local_70;
    pSVar6 = Builder::makeStore(&local_38,4,local_50,local_64,(Expression *)pLVar5,
                                (Expression *)local_60,(Type)0x2,
                                (Name)(curr->memory).super_IString.str);
    local_60 = (Unary *)lowerStoreI32(this,pSVar6);
    pLVar5 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar5->index = (Index)local_58;
    (pLVar5->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 3;
    right = Builder::makeConst<long>(&local_38,0x20);
    value = Builder::makeBinary(&local_38,ShrUInt64,(Expression *)pLVar5,(Expression *)right);
    local_58 = Builder::makeUnary(&local_38,WrapInt64,(Expression *)value);
    aVar2 = (curr->offset).addr;
    local_50.addr._0_4_ = (int)(curr->align).addr;
    pLVar5 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar5->index = local_3c;
    (pLVar5->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
         (uintptr_t)local_70;
    pSVar6 = Builder::makeStore(&local_38,4,(Address)(aVar2 + 4),(uint)local_50.addr,
                                (Expression *)pLVar5,(Expression *)local_58,(Type)0x2,
                                (Name)(curr->memory).super_IString.str);
    local_90 = lowerStoreI32(this,pSVar6);
    local_88._0_8_ = &local_a8;
    local_a8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         local_88._16_8_;
    local_a8.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)local_48;
    local_a8.value = (Expression *)local_60;
    local_88._8_8_ = (Drop *)0x4;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_60;
    expression = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                           (&local_38,(initializer_list<wasm::Expression_*> *)local_88,type_00);
    break;
  default:
    handle_unreachable("unhandled unaligned store",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                       ,0x14e);
  }
LAB_00961bc4:
  Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
              ).
              super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
              .super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>,
             (Expression *)expression);
  return;
}

Assistant:

void visitStore(Store* curr) {
    Builder builder(*getModule());
    // If unreachable, just remove the store, which removes the unaligned
    // operation in a trivial way.
    if (curr->type == Type::unreachable) {
      replaceCurrent(builder.makeBlock(
        {builder.makeDrop(curr->ptr), builder.makeDrop(curr->value)}));
      return;
    }
    if (curr->align == 0 || curr->align == curr->bytes) {
      // Nothing to do: leave the node unchanged. All code lower down assumes
      // the operation is unaligned.
      return;
    }
    auto type = curr->value->type.getBasic();
    Expression* replacement;
    switch (type) {
      default:
        WASM_UNREACHABLE("unhandled unaligned store");
      case Type::i32:
        replacement = lowerStoreI32(curr);
        break;
      case Type::f32:
        curr->type = Type::i32;
        curr->value = builder.makeUnary(ReinterpretFloat32, curr->value);
        replacement = lowerStoreI32(curr);
        break;
      case Type::i64:
      case Type::f64:
        if (type == Type::i64 && curr->bytes != 8) {
          // A store of <64 bits.
          curr->type = Type::i32;
          curr->value = builder.makeUnary(WrapInt64, curr->value);
          replacement = lowerStoreI32(curr);
          break;
        }
        // Otherwise, fall through to f64 case for a 64-bit load.
        // Ensure an integer input value.
        auto* value = curr->value;
        if (type == Type::f64) {
          value = builder.makeUnary(ReinterpretFloat64, value);
        }
        // Store as two 32-bit pieces.
        auto mem = getModule()->getMemory(curr->memory);
        auto addressType = mem->addressType;
        auto tempPtr = builder.addVar(getFunction(), addressType);
        auto* setPtr = builder.makeLocalSet(tempPtr, curr->ptr);
        auto tempValue = builder.addVar(getFunction(), Type::i64);
        auto* setValue = builder.makeLocalSet(tempValue, value);
        Expression* low = builder.makeUnary(
          WrapInt64, builder.makeLocalGet(tempValue, Type::i64));
        low = lowerStoreI32(
          builder.makeStore(4,
                            curr->offset,
                            curr->align,
                            builder.makeLocalGet(tempPtr, addressType),
                            low,
                            Type::i32,
                            curr->memory));
        Expression* high =
          builder.makeBinary(ShrUInt64,
                             builder.makeLocalGet(tempValue, Type::i64),
                             builder.makeConst(int64_t(32)));
        high = builder.makeUnary(WrapInt64, high);
        // Note that the alignment is assumed to be the same here, even though
        // we add an offset of 4. That is because this is an unaligned store, so
        // the alignment is 1, 2, or 4, which means it stays the same after
        // adding 4.
        high = lowerStoreI32(
          builder.makeStore(4,
                            curr->offset + 4,
                            curr->align,
                            builder.makeLocalGet(tempPtr, addressType),
                            high,
                            Type::i32,
                            curr->memory));
        replacement = builder.makeBlock({setPtr, setValue, low, high});
        break;
    }
    replaceCurrent(replacement);
  }